

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<unsigned_char,_int,_6>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uchar *lhs,int *rhs,uchar *result)

{
  code *pcVar1;
  byte bVar2;
  long lVar3;
  undefined1 *in_RDX;
  int *in_RSI;
  byte *in_RDI;
  int64_t tmp;
  
  lVar3 = (ulong)*in_RDI + (long)*in_RSI;
  if (SCARRY8((ulong)*in_RDI,(long)*in_RSI)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = std::numeric_limits<unsigned_char>::max();
  if (lVar3 <= (long)(ulong)bVar2) {
    bVar2 = std::numeric_limits<unsigned_char>::min();
    if ((long)(ulong)bVar2 <= lVar3) {
      *in_RDX = (char)lVar3;
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // 32-bit or less - one or both are signed
        std::int64_t tmp = (std::int64_t)lhs + (std::int64_t)rhs;

        if( tmp <= (std::int64_t)std::numeric_limits<T>::max() && tmp >= (std::int64_t)std::numeric_limits<T>::min() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }